

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64_na(char *s,size_t len)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar8 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                  (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar8 >> 0x2f ^ uVar8) * -0x651e95c4d06fbfb1;
        }
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar8 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar5;
        uVar8 = (uVar8 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar8) * lVar5;
        uVar8 = uVar8 >> 0x2f ^ uVar8;
      }
      else {
        uVar8 = *(ulong *)(s + (len - 8));
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar2 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar3 = ((uVar2 >> 0x19 | uVar2 << 0x27) + uVar8) * lVar5;
        uVar8 = ((uVar8 >> 0x25 | uVar8 << 0x1b) * lVar5 + uVar2 ^ uVar3) * lVar5;
        uVar8 = (uVar8 >> 0x2f ^ uVar3 ^ uVar8) * lVar5;
        uVar8 = uVar8 >> 0x2f ^ uVar8;
      }
      goto LAB_0017e956;
    }
    lVar5 = len * 2 + -0x651e95c4d06fbfb1;
    uVar2 = *(long *)(s + (len - 8)) * lVar5;
    uVar8 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar3 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar8 = (uVar2 >> 0x1e | uVar2 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
            *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar2 = (uVar3 >> 0x12 | uVar3 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
  }
  else {
    if (0x40 < len) {
      uVar2 = len - 1 & 0xffffffffffffffc0;
      uVar8 = (ulong)((uint)(len - 1) & 0x3f);
      if (s + (len - 0x40) == s + (uVar8 - 0x3f) + uVar2) {
        lVar10 = *(long *)s + 0x1529cba0ca458ff;
        lVar5 = uVar8 + uVar2;
        lVar12 = 0x226bb95b4e64b6d4;
        uVar14 = 0x134a747f856d0526;
        uVar17 = 0;
        lVar9 = 0;
        uVar3 = 0;
        lVar16 = 0;
        lVar4 = 0;
        do {
          lVar1 = uVar17 + 0x10;
          lVar7 = lVar4 * -0x4b6d499041670d8d + *(long *)(s + uVar17);
          uVar13 = lVar12 + lVar4 + *(long *)(s + uVar17 + 0x30);
          uVar11 = lVar10 + lVar16 + lVar12 + *(long *)(s + uVar17 + 8);
          uVar15 = *(long *)(s + uVar17 + 8) + lVar7 + *(long *)(s + lVar1);
          lVar12 = lVar16 + *(long *)(s + uVar17 + 0x28) +
                   (uVar13 >> 0x2a | uVar13 * 0x400000) * -0x4b6d499041670d8d;
          lVar10 = (uVar14 + lVar9 >> 0x21 | (uVar14 + lVar9) * 0x80000000) * -0x4b6d499041670d8d;
          uVar14 = (uVar11 >> 0x25 | uVar11 * 0x8000000) * -0x4b6d499041670d8d ^ uVar3;
          lVar6 = uVar3 + lVar10 + *(long *)(s + uVar17 + 0x20);
          lVar16 = uVar15 + *(long *)(s + uVar17 + 0x18);
          uVar3 = lVar9 + lVar7 + *(long *)(s + uVar17 + 0x18) + uVar14;
          lVar4 = lVar7 + (uVar15 >> 0x2c | uVar15 * 0x100000) + (uVar3 >> 0x15 | uVar3 << 0x2b);
          lVar9 = uVar17 + 0x38;
          uVar3 = *(long *)(s + uVar17 + 0x28) + *(long *)(s + uVar17 + 0x30) + lVar6;
          uVar17 = uVar17 + 0x40;
          uVar11 = *(long *)(s + lVar1) + lVar6 + lVar12 + *(long *)(s + lVar9);
          lVar9 = uVar3 + *(long *)(s + lVar9);
          uVar3 = lVar6 + (uVar3 >> 0x2c | uVar3 * 0x100000) + (uVar11 >> 0x15 | uVar11 << 0x2b);
        } while (uVar2 != uVar17);
        lVar1 = (uVar14 & 0xff) * 2 + -0x4b6d499041670d8d;
        lVar16 = lVar16 + lVar9 + uVar8;
        lVar6 = lVar4 * lVar1 + *(long *)(s + lVar5 + -0x3f);
        lVar9 = lVar9 + uVar8 + lVar16;
        uVar14 = uVar14 + lVar9;
        uVar2 = lVar12 + lVar4 + *(long *)(s + lVar5 + -0xf);
        uVar8 = lVar10 + lVar12 + *(long *)(s + lVar5 + -0x37) + lVar16;
        uVar13 = *(long *)(s + lVar5 + -0x37) + *(long *)(s + lVar5 + -0x2f) + lVar6;
        uVar11 = lVar16 * 9 + *(long *)(s + lVar5 + -0x17) +
                 (uVar2 >> 0x2a | uVar2 * 0x400000) * lVar1;
        uVar17 = uVar3 * 9 ^ (uVar8 >> 0x25 | uVar8 * 0x8000000) * lVar1;
        uVar14 = uVar14 >> 0x21 | uVar14 * 0x80000000;
        lVar4 = uVar14 * lVar1 + uVar3 + *(long *)(s + lVar5 + -0x1f);
        uVar3 = lVar9 + lVar6 + uVar17 + *(long *)(s + lVar5 + -0x27);
        uVar8 = *(long *)(s + lVar5 + -0x17) + *(long *)(s + lVar5 + -0xf) + lVar4;
        uVar2 = uVar8 + *(long *)(s + lVar5 + -7);
        uVar15 = *(long *)(s + lVar5 + -0x2f) + uVar11 + *(long *)(s + lVar5 + -7) + lVar4;
        uVar8 = (uVar8 >> 0x2c | uVar8 * 0x100000) + lVar4 + (uVar15 >> 0x15 | uVar15 << 0x2b);
        uVar15 = (uVar13 + *(long *)(s + lVar5 + -0x27) ^ uVar2) * lVar1;
        uVar3 = ((uVar13 >> 0x2c | uVar13 * 0x100000) + lVar6 + (uVar3 >> 0x15 | uVar3 << 0x2b) ^
                uVar8) * lVar1;
        uVar2 = (uVar15 >> 0x2f ^ uVar2 ^ uVar15) * lVar1;
        uVar8 = (uVar3 >> 0x2f ^ uVar8 ^ uVar3) * lVar1;
        uVar8 = ((uVar8 >> 0x2f ^ uVar8) + uVar14) * lVar1;
        uVar2 = ((uVar11 >> 0x2f ^ uVar11) * -0x3c5a37a36834ced9 + uVar17 +
                 (uVar2 >> 0x2f ^ uVar2) * lVar1 ^ uVar8) * lVar1;
        uVar8 = (uVar2 >> 0x2f ^ uVar8 ^ uVar2) * lVar1;
        return (uVar8 >> 0x2f ^ uVar8) * lVar1;
      }
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash-c.c"
                    ,0x1b1,"uint64_t farmhash64_na(const char *, size_t)");
    }
    lVar5 = len * 2 + -0x651e95c4d06fbfb1;
    lVar4 = *(long *)s * -0x651e95c4d06fbfb1;
    uVar3 = *(long *)(s + (len - 8)) * lVar5;
    uVar8 = lVar4 + *(long *)(s + 8);
    uVar14 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar2 = lVar4 + *(long *)(s + 0x18);
    uVar8 = (uVar3 >> 0x1e | uVar3 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
            *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar3 = (uVar14 >> 0x12 | uVar14 << 0x2e) + lVar4 + uVar3;
    uVar14 = (uVar8 ^ uVar3) * lVar5;
    uVar17 = (uVar8 + *(long *)(s + (len - 0x20))) * lVar5;
    uVar8 = *(long *)(s + 0x10) * lVar5 + *(long *)(s + 0x18);
    uVar3 = (uVar14 >> 0x2f ^ uVar3 ^ uVar14) * lVar5;
    uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)(s + 0x10) * lVar5 + uVar17;
    uVar8 = (uVar17 >> 0x1e | uVar17 << 0x22) + (uVar8 >> 0x2b | uVar8 * 0x200000) +
            ((uVar3 >> 0x2f ^ uVar3) * lVar5 + *(long *)(s + (len - 0x18))) * lVar5;
  }
  uVar8 = (uVar8 ^ uVar2) * lVar5;
  uVar8 = (uVar8 >> 0x2f ^ uVar2 ^ uVar8) * lVar5;
  uVar8 = uVar8 >> 0x2f ^ uVar8;
LAB_0017e956:
  return uVar8 * lVar5;
}

Assistant:

uint64_t farmhash64_na(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_na_len_33_to_64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = smix(y * k2 + 113) * k2;
  uint128_c_t v = make_uint128_c_t(0, 0);
  uint128_c_t w = make_uint128_c_t(0, 0);
  x = x * k2 + fetch64(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_na_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.a += ((len - 1) & 63);
  v.a += w.a;
  w.a += v.a;
  x = ror64(x + y + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y + v.b + fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a * 9 + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  swap64(&z, &x);
  return farmhash_len_16_mul(farmhash_len_16_mul(v.a, w.a, mul) + smix(y) * k0 + z,
                   farmhash_len_16_mul(v.b, w.b, mul) + x,
                   mul);
}